

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_reader.cpp
# Opt level: O2

void __thiscall
duckdb::ParquetColumnSchema::ParquetColumnSchema
          (ParquetColumnSchema *this,idx_t max_define,idx_t max_repeat,idx_t schema_index,
          idx_t column_index,ParquetColumnSchemaType schema_type)

{
  string local_68;
  LogicalType local_48 [24];
  
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  duckdb::LogicalType::LogicalType(local_48,INVALID);
  ParquetColumnSchema(this,&local_68,local_48,max_define,max_repeat,schema_index,column_index,
                      schema_type);
  duckdb::LogicalType::~LogicalType(local_48);
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

ParquetColumnSchema::ParquetColumnSchema(idx_t max_define, idx_t max_repeat, idx_t schema_index, idx_t column_index,
                                         ParquetColumnSchemaType schema_type)
    : ParquetColumnSchema(string(), LogicalTypeId::INVALID, max_define, max_repeat, schema_index, column_index,
                          schema_type) {
}